

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMoveSrRg<(moira::Instr)75,(moira::Mode)0,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Dn local_28;
  u16 local_22;
  Dn dst;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  local_22 = op;
  _dst = addr;
  Dn::Dn(&local_28,op & 7);
  if (str->style->syntax == MUSASHI) {
    pSVar1 = StrWriter::operator<<(str);
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
    pSVar1 = StrWriter::operator<<(pSVar1);
    pSVar1 = StrWriter::operator<<(pSVar1);
    StrWriter::operator<<(pSVar1,local_28);
  }
  else {
    pSVar1 = StrWriter::operator<<(str);
    pSVar1 = StrWriter::operator<<(pSVar1);
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
    pSVar1 = StrWriter::operator<<(pSVar1);
    pSVar1 = StrWriter::operator<<(pSVar1);
    StrWriter::operator<<(pSVar1,local_28);
  }
  return;
}

Assistant:

void
Moira::dasmMoveSrRg(StrWriter &str, u32 &addr, u16 op) const
{
    auto dst = Dn ( _____________xxx(op) );

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << Sr{} << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Sr{} << Sep{} << dst;
    }
}